

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::DepthShader::shadeFragments
          (DepthShader *this,FragmentPacket *packets,int numPackets,FragmentShadingContext *context)

{
  int iVar1;
  GenericVec4 *pGVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  
  if (0 < numPackets) {
    uVar3 = *(undefined8 *)&this->u_color->value;
    uVar4 = *(undefined8 *)((long)&this->u_color->value + 8);
    pGVar2 = context->outputArray;
    iVar1 = context->numFragmentOutputs;
    iVar5 = 0;
    uVar6 = 0;
    do {
      lVar7 = 4;
      iVar8 = iVar5;
      do {
        *(undefined8 *)&pGVar2[iVar8].v = uVar3;
        *(undefined8 *)((long)&pGVar2[iVar8].v + 8) = uVar4;
        iVar8 = iVar8 + iVar1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + iVar1 * 4;
    } while (uVar6 != (uint)numPackets);
  }
  return;
}

Assistant:

void DepthShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 color(u_color.value.f4);

	DE_UNREF(packets);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
}